

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

result_type __thiscall
math::wide_integer::uniform_int_distribution<48u,unsigned_short,void,false>::
generate<std::linear_congruential_engine<unsigned_int,48271u,0u,2147483647u>,32>
          (uniform_int_distribution<48u,unsigned_short,void,false> *this,
          linear_congruential_engine<unsigned_int,_48271U,_0U,_2147483647U> *input_generator,
          param_type *input_params)

{
  param_type *ppVar1;
  bool bVar2;
  enable_if_t<(_false),_uintwide_t<48U,_unsigned_short>_> eVar3;
  uintwide_t<24U,_unsigned_char,_void,_false> uVar4;
  uint uVar5;
  undefined5 extraout_var;
  undefined5 extraout_var_00;
  undefined5 extraout_var_01;
  long lVar6;
  ulong uVar7;
  byte bVar8;
  uint uVar9;
  result_type result;
  result_type range;
  uintwide_t<48U,_unsigned_short,_void,_false> local_60 [8];
  undefined4 local_58;
  undefined2 local_54;
  undefined4 local_50;
  undefined2 local_4c;
  undefined4 local_48;
  undefined2 local_44;
  param_type *local_40;
  undefined4 local_38;
  undefined2 local_34;
  
  bVar8 = 0;
  local_40 = input_params;
  uintwide_t<48u,unsigned_short,void,false>::uintwide_t<unsigned_char>(unsigned_char,std::
  enable_if<(std::is_integral<unsigned_char>::value&&std::is_unsigned<unsigned_char>::value)&&(std::
  numeric_limits<unsigned_char>::digits<=std::numeric_limits<unsigned_short>::digits),void>::type__
            (local_60,'\0',
             (enable_if_t<(std::is_integral<unsigned_char>::value_&&_std::is_unsigned<unsigned_char>::value_&&_(std::numeric_limits<unsigned_char>::digits_<__std::numeric_limits<limb_type>::digits))>
              *)0x0);
  uVar9 = 0;
  lVar6 = 0;
  uVar5 = 0;
  for (uVar7 = 0; ppVar1 = local_40, uVar7 != 6; uVar7 = uVar7 + 1) {
    if ((uVar7 & 3) == 0) {
      uVar5 = std::linear_congruential_engine<unsigned_int,_48271U,_0U,_2147483647U>::operator()
                        (input_generator);
    }
    *(ushort *)(local_60 + lVar6) =
         *(ushort *)(local_60 + lVar6) |
         (ushort)((uVar5 >> (sbyte)((int)(uVar7 & 3) << 3) & 0xff) << (bVar8 & 8));
    lVar6 = lVar6 + (ulong)(uVar9 & 2);
    uVar9 = uVar9 + 2;
    bVar8 = bVar8 + 8;
  }
  local_48._0_3_ = local_40->param_a;
  local_48._3_1_ = (local_40->param_b).values.super_array<unsigned_char,_3UL>.elems[0];
  local_44 = *(undefined2 *)((local_40->param_b).values.super_array<unsigned_char,_3UL>.elems + 1);
  eVar3 = uintwide_t<48U,_unsigned_short,_void,_false>::limits_helper_min<false>();
  local_58 = (undefined4)CONCAT53(extraout_var,eVar3.values.super_array<unsigned_char,_3UL>.elems);
  local_54 = (undefined2)((uint5)extraout_var >> 8);
  bVar2 = uintwide_t<48U,_unsigned_short,_void,_false>::operator!=
                    ((uintwide_t<48U,_unsigned_short,_void,_false> *)&local_48,
                     (uintwide_t<24U,_unsigned_char,_void,_false> *)&local_58);
  if (!bVar2) {
    local_50._0_3_ = ppVar1[1].param_a;
    local_50._3_1_ = ppVar1[1].param_b.values.super_array<unsigned_char,_3UL>.elems[0];
    local_4c = *(undefined2 *)(ppVar1[1].param_b.values.super_array<unsigned_char,_3UL>.elems + 1);
    eVar3 = uintwide_t<48U,_unsigned_short,_void,_false>::limits_helper_max<false>();
    local_38 = (undefined4)
               CONCAT53(extraout_var_00,eVar3.values.super_array<unsigned_char,_3UL>.elems);
    local_34 = (undefined2)((uint5)extraout_var_00 >> 8);
    bVar2 = uintwide_t<48U,_unsigned_short,_void,_false>::operator!=
                      ((uintwide_t<48U,_unsigned_short,_void,_false> *)&local_50,
                       (uintwide_t<24U,_unsigned_char,_void,_false> *)&local_38);
    if (!bVar2) goto LAB_0014120b;
  }
  local_58._0_3_ = ppVar1[1].param_a;
  local_58._3_1_ = ppVar1[1].param_b.values.super_array<unsigned_char,_3UL>.elems[0];
  local_54 = *(undefined2 *)(ppVar1[1].param_b.values.super_array<unsigned_char,_3UL>.elems + 1);
  local_50._0_3_ = ppVar1->param_a;
  local_50._3_1_ = (ppVar1->param_b).values.super_array<unsigned_char,_3UL>.elems[0];
  local_4c = *(undefined2 *)((ppVar1->param_b).values.super_array<unsigned_char,_3UL>.elems + 1);
  uVar4 = wide_integer::operator-
                    ((uintwide_t<24U,_unsigned_char,_void,_false> *)&local_58,
                     (uintwide_t<24U,_unsigned_char,_void,_false> *)&local_50);
  local_48 = (undefined4)
             CONCAT53(extraout_var_01,uVar4.values.super_array<unsigned_char,_3UL>.elems);
  local_44 = (undefined2)((uint5)extraout_var_01 >> 8);
  uintwide_t<48U,_unsigned_short,_void,_false>::preincrement
            ((uintwide_t<24U,_unsigned_char,_void,_false> *)&local_48);
  uintwide_t<48U,_unsigned_short,_void,_false>::operator%=
            (local_60,(uintwide_t<24U,_unsigned_char,_void,_false> *)&local_48);
  local_58._0_3_ = ppVar1->param_a;
  local_58._3_1_ = (ppVar1->param_b).values.super_array<unsigned_char,_3UL>.elems[0];
  local_54 = *(undefined2 *)((ppVar1->param_b).values.super_array<unsigned_char,_3UL>.elems + 1);
  uintwide_t<48U,_unsigned_short,_void,_false>::operator+=
            (local_60,(uintwide_t<24U,_unsigned_char,_void,_false> *)&local_58);
LAB_0014120b:
  return (representation_type)(array<unsigned_char,_3UL>)SUB43(local_60._0_4_,0);
}

Assistant:

constexpr auto generate(GeneratorType& input_generator,
                            const param_type& input_params) const -> result_type
    {
      // Generate random numbers r, where a <= r <= b.

      auto result = static_cast<result_type>(static_cast<std::uint8_t>(UINT8_C(0)));

      using local_limb_type = typename result_type::limb_type;

      using generator_result_type = typename GeneratorType::result_type;

      constexpr auto digits_generator_result_type = static_cast<std::uint32_t>(GeneratorResultBits);

      static_assert(static_cast<std::uint32_t>(digits_generator_result_type % static_cast<std::uint32_t>(UINT8_C(8))) == static_cast<std::uint32_t>(UINT8_C(0)),
                    "Error: Generator result type must have a multiple of 8 bits.");

      constexpr auto digits_limb_ratio =
        static_cast<std::uint32_t>(std::numeric_limits<local_limb_type>::digits / static_cast<int>(INT8_C(8)));

      constexpr auto digits_gtor_ratio = static_cast<std::uint32_t>(digits_generator_result_type / static_cast<std::uint32_t>(UINT8_C(8)));

      generator_result_type value = generator_result_type();

      auto it = result.representation().begin(); // NOLINT(llvm-qualified-auto,readability-qualified-auto,altera-id-dependent-backward-branch)

      auto j = static_cast<unsigned_fast_type>(UINT8_C(0));

      while(it != result.representation().end()) // NOLINT(altera-id-dependent-backward-branch)
      {
        if(static_cast<unsigned_fast_type>(j % static_cast<unsigned_fast_type>(digits_gtor_ratio)) == static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          value = input_generator();
        }

        const auto right_shift_amount =
          static_cast<unsigned>
          (
              static_cast<unsigned_fast_type>(j % digits_gtor_ratio)
            * static_cast<unsigned_fast_type>(UINT8_C(8))
          );

        const auto next_byte = static_cast<std::uint8_t>(value >> right_shift_amount);

        *it =
          static_cast<typename result_type::limb_type>
          (
            *it | static_cast<local_limb_type>(static_cast<local_limb_type>(next_byte) << static_cast<unsigned>(static_cast<unsigned_fast_type>(j % digits_limb_ratio) * static_cast<unsigned_fast_type>(UINT8_C(8))))
          );

        ++j;

        if(static_cast<unsigned_fast_type>(j % digits_limb_ratio) == static_cast<unsigned_fast_type>(UINT8_C(0)))
        {
          ++it;
        }
      }

      if(   (input_params.get_a() != (std::numeric_limits<result_type>::min)())
         || (input_params.get_b() != (std::numeric_limits<result_type>::max)()))
      {
        // Note that this restricts the range r to:
        //   r = { [input_generator() % ((b - a) + 1)] + a }

        result_type range(input_params.get_b() - input_params.get_a());

        ++range;

        result %= range;
        result += input_params.get_a();
      }

      return result;
    }